

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void BrotliConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  byte bVar1;
  uint16_t uVar2;
  ulong uStack_70;
  int code;
  size_t i;
  uint16_t next_code [16];
  uint16_t bl_count [16];
  uint16_t *bits_local;
  size_t len_local;
  uint8_t *depth_local;
  
  memset(next_code + 0xc,0,0x20);
  uVar2 = 0;
  for (uStack_70 = 0; uStack_70 < len; uStack_70 = uStack_70 + 1) {
    next_code[(ulong)depth[uStack_70] + 0xc] = next_code[(ulong)depth[uStack_70] + 0xc] + 1;
  }
  next_code[0xc] = 0;
  for (uStack_70 = 1; uStack_70 < 0x10; uStack_70 = uStack_70 + 1) {
    uVar2 = (uVar2 + next_code[uStack_70 + 0xb]) * 2;
    next_code[uStack_70 - 4] = uVar2;
  }
  for (uStack_70 = 0; uStack_70 < len; uStack_70 = uStack_70 + 1) {
    if (depth[uStack_70] != '\0') {
      bVar1 = depth[uStack_70];
      uVar2 = next_code[(ulong)depth[uStack_70] - 4];
      next_code[(ulong)depth[uStack_70] - 4] = uVar2 + 1;
      uVar2 = BrotliReverseBits((ulong)bVar1,uVar2);
      bits[uStack_70] = uVar2;
    }
  }
  return;
}

Assistant:

void BrotliConvertBitDepthsToSymbols(const uint8_t* depth,
                                     size_t len,
                                     uint16_t* bits) {
  /* In Brotli, all bit depths are [1..15]
     0 bit depth means that the symbol does not exist. */
  uint16_t bl_count[MAX_HUFFMAN_BITS] = { 0 };
  uint16_t next_code[MAX_HUFFMAN_BITS];
  size_t i;
  int code = 0;
  for (i = 0; i < len; ++i) {
    ++bl_count[depth[i]];
  }
  bl_count[0] = 0;
  next_code[0] = 0;
  for (i = 1; i < MAX_HUFFMAN_BITS; ++i) {
    code = (code + bl_count[i - 1]) << 1;
    next_code[i] = (uint16_t)code;
  }
  for (i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = BrotliReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}